

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O3

void ga_sort_permutation(Integer *pn,Integer *index,Integer *base)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  Integer IVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  Integer *pIVar9;
  ulong uVar10;
  long *plVar11;
  long *plVar12;
  long lVar13;
  
  uVar10 = *pn;
  if (1 < (long)uVar10) {
    uVar6 = uVar10 >> 1;
    uVar10 = (ulong)((uint)uVar10 & 1);
    lVar5 = uVar6 * 0x10 + uVar10 * 8 + -8;
    if (uVar6 != 1) {
      plVar8 = base + uVar10 + uVar6 * 2 + -1;
      do {
        plVar7 = base + (uVar6 - 1) + uVar6;
        plVar11 = base + (uVar6 - 1);
        uVar10 = uVar6;
        while (plVar7 <= plVar8) {
          uVar10 = uVar10 * 2;
          if (plVar7 == plVar8) {
            lVar13 = *plVar8;
            plVar12 = plVar8;
          }
          else {
            lVar1 = *plVar7;
            lVar2 = plVar7[1];
            lVar13 = lVar1;
            if (lVar1 < lVar2) {
              lVar13 = lVar2;
            }
            plVar12 = plVar7 + 1;
            if (lVar2 <= lVar1) {
              plVar12 = plVar7;
            }
            uVar10 = uVar10 | lVar1 < lVar2;
          }
          lVar1 = *plVar11;
          if (lVar13 <= lVar1) break;
          *plVar11 = lVar13;
          *plVar12 = lVar1;
          uVar3 = *(undefined8 *)((long)index + ((long)plVar11 - (long)base));
          *(undefined8 *)((long)index + ((long)plVar11 - (long)base)) =
               *(undefined8 *)((long)index + ((long)plVar12 - (long)base));
          *(undefined8 *)((long)index + ((long)plVar12 - (long)base)) = uVar3;
          plVar11 = plVar12;
          plVar7 = plVar12 + uVar10;
        }
        uVar6 = uVar6 - 1;
      } while (uVar6 != 1);
    }
    if (lVar5 != 0) {
      do {
        if (7 < lVar5) {
          plVar8 = (long *)((long)base + lVar5);
          uVar10 = 1;
          plVar7 = base + 1;
          pIVar9 = base;
          do {
            uVar10 = uVar10 * 2;
            if (plVar7 == plVar8) {
              lVar13 = *plVar8;
              plVar11 = plVar8;
            }
            else {
              lVar1 = *plVar7;
              lVar2 = plVar7[1];
              lVar13 = lVar1;
              if (lVar1 < lVar2) {
                lVar13 = lVar2;
              }
              plVar11 = plVar7 + 1;
              if (lVar2 <= lVar1) {
                plVar11 = plVar7;
              }
              uVar10 = uVar10 | lVar1 < lVar2;
            }
            lVar1 = *pIVar9;
            if (lVar13 <= lVar1) break;
            *pIVar9 = lVar13;
            *plVar11 = lVar1;
            uVar3 = *(undefined8 *)((long)index + ((long)pIVar9 - (long)base));
            *(undefined8 *)((long)index + ((long)pIVar9 - (long)base)) =
                 *(undefined8 *)((long)index + ((long)plVar11 - (long)base));
            *(undefined8 *)((long)index + ((long)plVar11 - (long)base)) = uVar3;
            plVar7 = plVar11 + uVar10;
            pIVar9 = plVar11;
          } while (plVar7 <= plVar8);
        }
        IVar4 = *base;
        *base = *(Integer *)((long)base + lVar5);
        *(Integer *)((long)base + lVar5) = IVar4;
        IVar4 = *index;
        *index = *(Integer *)((long)index + lVar5);
        *(Integer *)((long)index + lVar5) = IVar4;
        lVar5 = lVar5 + -8;
      } while (lVar5 != 0);
    }
  }
  return;
}

Assistant:

void ga_sort_permutation(pn, index, base)
     Integer *pn;
     Integer *index;
     Integer *base;
{
  if (*pn < 2) return;
#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    Integer itmp;\
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    itmp=index[ia]; index[ia]=index[ib]; index[ib] = itmp;\
   }
  INDEX_SORT(base,pn,SWAP);
}